

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absVta.c
# Opt level: O2

Vta_Obj_t * Vga_ManFindOrAdd(Vta_Man_t *p,int iObj,int iFrame)

{
  int iVar1;
  Vta_Obj_t *pVVar2;
  int *piVar3;
  
  if ((iObj < 0) || (iFrame < -1)) {
    __assert_fail("iObj >= 0 && iFrame >= -1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/abs/absVta.c"
                  ,0x125,"Vta_Obj_t *Vga_ManFindOrAdd(Vta_Man_t *, int, int)");
  }
  iVar1 = p->nObjs;
  if (iVar1 == p->nObjsAlloc) {
    if (p->pObjs == (Vta_Obj_t *)0x0) {
      pVVar2 = (Vta_Obj_t *)malloc((long)iVar1 << 5);
    }
    else {
      pVVar2 = (Vta_Obj_t *)realloc(p->pObjs,(long)iVar1 << 5);
      iVar1 = p->nObjsAlloc;
    }
    p->pObjs = pVVar2;
    memset(pVVar2 + iVar1,0,(long)iVar1 * 0x10);
    p->nObjsAlloc = iVar1 * 2;
    free(p->pBins);
    iVar1 = Abc_PrimeCudd(p->nBins * 2);
    p->nBins = iVar1;
    piVar3 = (int *)calloc((long)iVar1,4);
    p->pBins = piVar3;
    for (iVar1 = 1; iVar1 < p->nObjs; iVar1 = iVar1 + 1) {
      pVVar2 = Vta_ManObj(p,iVar1);
      if (pVVar2 == (Vta_Obj_t *)0x0) break;
      pVVar2->iNext = 0;
      piVar3 = Vga_ManLookup(p,pVVar2->iObj,pVVar2->iFrame);
      if (*piVar3 != 0) {
        __assert_fail("*pPlace == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/abs/absVta.c"
                      ,0x134,"Vta_Obj_t *Vga_ManFindOrAdd(Vta_Man_t *, int, int)");
      }
      *piVar3 = iVar1;
    }
  }
  piVar3 = Vga_ManLookup(p,iObj,iFrame);
  if (*piVar3 != 0) {
    pVVar2 = Vta_ManObj(p,*piVar3);
    return pVVar2;
  }
  iVar1 = p->nObjs;
  p->nObjs = iVar1 + 1;
  *piVar3 = iVar1;
  pVVar2 = Vta_ManObj(p,iVar1);
  pVVar2->iObj = iObj;
  pVVar2->iFrame = iFrame;
  return pVVar2;
}

Assistant:

static inline Vta_Obj_t * Vga_ManFindOrAdd( Vta_Man_t * p, int iObj, int iFrame )
{
    Vta_Obj_t * pThis;
    int i, * pPlace;
    assert( iObj >= 0 && iFrame >= -1 );
    if ( p->nObjs == p->nObjsAlloc )
    {
        // resize objects
        p->pObjs = ABC_REALLOC( Vta_Obj_t, p->pObjs, 2 * p->nObjsAlloc );
        memset( p->pObjs + p->nObjsAlloc, 0, p->nObjsAlloc * sizeof(Vta_Obj_t) );
        p->nObjsAlloc *= 2;
        // rehash entries in the table
        ABC_FREE( p->pBins );
        p->nBins = Abc_PrimeCudd( 2 * p->nBins );
        p->pBins = ABC_CALLOC( int, p->nBins );
        Vta_ManForEachObj( p, pThis, i )
        {
            pThis->iNext = 0;
            pPlace = Vga_ManLookup( p, pThis->iObj, pThis->iFrame );
            assert( *pPlace == 0 );
            *pPlace = i;
        }
    }
    pPlace = Vga_ManLookup( p, iObj, iFrame );
    if ( *pPlace )
        return Vta_ManObj(p, *pPlace);
    *pPlace = p->nObjs++;
    pThis = Vta_ManObj(p, *pPlace);
    pThis->iObj   = iObj;
    pThis->iFrame = iFrame;
    return pThis;
}